

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonObjectStep(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  undefined8 *puVar2;
  char *in_RDX;
  undefined4 in_ESI;
  sqlite3_value *in_RDI;
  JsonString *unaff_retaddr;
  u32 n;
  char *z;
  JsonString *pStr;
  undefined7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  u32 N;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = 0xaaaaaaaa;
  puVar2 = (undefined8 *)
           sqlite3_aggregate_context
                     ((sqlite3_context *)
                      CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
  if (puVar2 != (undefined8 *)0x0) {
    if (puVar2[1] == 0) {
      jsonStringInit((JsonString *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                     (sqlite3_context *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      jsonAppendChar((JsonString *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcf);
    }
    else if (1 < (ulong)puVar2[3]) {
      jsonAppendChar((JsonString *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcf);
    }
    *puVar2 = in_RDI;
    sqlite3_value_text((sqlite3_value *)0x230f3f);
    N = (u32)((ulong)puVar2 >> 0x20);
    iVar1 = sqlite3Strlen30((char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    jsonAppendString((JsonString *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,N);
    jsonAppendChar((JsonString *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf
                  );
    jsonAppendSqlValue(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

static void jsonObjectStep(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString *pStr;
  const char *z;
  u32 n;
  UNUSED_PARAMETER(argc);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, sizeof(*pStr));
  if( pStr ){
    if( pStr->zBuf==0 ){
      jsonStringInit(pStr, ctx);
      jsonAppendChar(pStr, '{');
    }else if( pStr->nUsed>1 ){
      jsonAppendChar(pStr, ',');
    }
    pStr->pCtx = ctx;
    z = (const char*)sqlite3_value_text(argv[0]);
    n = sqlite3Strlen30(z);
    jsonAppendString(pStr, z, n);
    jsonAppendChar(pStr, ':');
    jsonAppendSqlValue(pStr, argv[1]);
  }
}